

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall Timer::restart(Timer *this,int interval,int flags,shared_ptr<EventLoop> *l)

{
  element_type *peVar1;
  int iVar2;
  SharedPtr loop;
  EventLoop *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  peVar1 = (l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    EventLoop::eventLoop();
  }
  else {
    local_50 = (l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    local_58 = peVar1;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
  }
  if (local_58 != (EventLoop *)0x0) {
    if (this->timerId != 0) {
      EventLoop::unregisterTimer(local_58,this->timerId);
    }
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = timerFired;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(Timer **)((long)local_48._M_unused._0_8_ + 0x10) = this;
    pcStack_30 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(Timer::*(Timer_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Timer::*(Timer_*,_std::_Placeholder<1>))(int)>_>
               ::_M_manager;
    iVar2 = EventLoop::registerTimer(local_58,(function<void_(int)> *)&local_48,interval,flags);
    this->timerId = iVar2;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void Timer::restart(int interval, int flags, const std::shared_ptr<EventLoop> &l)
{
    EventLoop::SharedPtr loop = l ? l : EventLoop::eventLoop();
    if (loop) {
        // ### this is a bit inefficient, should revisit
        if (timerId)
            loop->unregisterTimer(timerId);
        timerId = loop->registerTimer(std::bind(&Timer::timerFired, this, std::placeholders::_1),
                                      interval, flags);
    }
}